

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void __thiscall buffer::trim_data(buffer *this)

{
  int iVar1;
  int iVar2;
  int bias;
  int used;
  buffer *this_local;
  
  iVar1 = (int)this->end_ - (int)this->begin_;
  iVar2 = (int)this->begin_ - (int)this->buffer_;
  if ((0 < iVar1) && (0 < iVar2)) {
    memmove(this->buffer_,this->buffer_ + iVar2,(long)iVar1);
  }
  this->begin_ = this->buffer_;
  this->end_ = this->begin_ + iVar1;
  return;
}

Assistant:

void buffer::trim_data()
{
    int used = end_ - begin_;
    int bias = begin_ - buffer_;
    if (used > 0 && bias > 0)
    {
        memmove(buffer_, buffer_ + bias, used);
    }

    begin_ = buffer_;
    end_ = begin_ + used;
}